

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdCreateKeyPair(void *handle,bool is_compressed,int network_type,char **pubkey,char **privkey,
                    char **wif)

{
  NetType net_type;
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *this;
  bool is_bitcoin;
  KeyApi api;
  char *work_wif;
  char *work_privkey;
  string privkey_wif;
  string local_88;
  Pubkey pubkey_obj;
  Privkey key;
  
  cfd::Initialize();
  is_bitcoin = true;
  net_type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
  if (is_bitcoin != false) {
    cfd::core::Pubkey::Pubkey(&pubkey_obj);
    privkey_wif._M_dataplus._M_p = (pointer)&privkey_wif.field_2;
    privkey_wif._M_string_length = 0;
    privkey_wif.field_2._M_allocated_capacity =
         privkey_wif.field_2._M_allocated_capacity & 0xffffffffffffff00;
    cfd::api::KeyApi::CreateKeyPair(&key,&api,is_compressed,&pubkey_obj,&privkey_wif,net_type);
    if (wif == (char **)0x0) {
      pcVar1 = (char *)0x0;
    }
    else {
      pcVar1 = cfd::capi::CreateString(&privkey_wif);
    }
    if (privkey == (char **)0x0) {
      pcVar2 = (char *)0x0;
    }
    else {
      cfd::core::Privkey::GetHex_abi_cxx11_(&local_88,&key);
      pcVar2 = cfd::capi::CreateString(&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    if (pubkey == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::Pubkey::GetHex_abi_cxx11_(&local_88,&pubkey_obj);
      pcVar3 = cfd::capi::CreateString(&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    if (pcVar2 != (char *)0x0) {
      *privkey = pcVar2;
    }
    if (pcVar1 != (char *)0x0) {
      *wif = pcVar1;
    }
    if (pcVar3 != (char *)0x0) {
      *pubkey = pcVar3;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
    std::__cxx11::string::~string((string *)&privkey_wif);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey_obj);
    return 0;
  }
  privkey_wif._M_dataplus._M_p = "cfdcapi_key.cpp";
  privkey_wif._M_string_length = CONCAT44(privkey_wif._M_string_length._4_4_,0x3f3);
  privkey_wif.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_7e5c41;
  cfd::core::logger::warn<>((CfdSourceLocation *)&privkey_wif,"privkey\'s network_type is invalid.")
  ;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&privkey_wif,"Failed to parameter. privkey\'s network_type is invalid.",
             (allocator *)&key);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,&privkey_wif);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateKeyPair(
    void* handle, bool is_compressed, int network_type, char** pubkey,
    char** privkey, char** wif) {
  char* work_pubkey = nullptr;
  char* work_privkey = nullptr;
  char* work_wif = nullptr;
  try {
    cfd::Initialize();

    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }

    KeyApi api;
    Pubkey pubkey_obj;
    std::string privkey_wif;
    Privkey key =
        api.CreateKeyPair(is_compressed, &pubkey_obj, &privkey_wif, net_type);

    if (wif != nullptr) {
      work_wif = CreateString(privkey_wif);
    }
    if (privkey != nullptr) {
      work_privkey = CreateString(key.GetHex());
    }
    if (pubkey != nullptr) {
      work_pubkey = CreateString(pubkey_obj.GetHex());
    }

    if (work_privkey != nullptr) *privkey = work_privkey;
    if (work_wif != nullptr) *wif = work_wif;
    if (work_pubkey != nullptr) *pubkey = work_pubkey;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(&work_privkey, &work_wif, &work_pubkey);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(&work_privkey, &work_wif, &work_pubkey);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(&work_privkey, &work_wif, &work_pubkey);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}